

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_catalog_entry.cpp
# Opt level: O3

int64_t __thiscall duckdb::SequenceCatalogEntry::CurrentValue(SequenceCatalogEntry *this)

{
  int64_t iVar1;
  int iVar2;
  SequenceException *this_00;
  string local_48;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  if ((this->data).usage_count != 0) {
    iVar1 = (this->data).last_value;
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return iVar1;
  }
  this_00 = (SequenceException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"currval: sequence is not yet defined in this session","");
  SequenceException::SequenceException(this_00,&local_48);
  __cxa_throw(this_00,&SequenceException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int64_t SequenceCatalogEntry::CurrentValue() {
	lock_guard<mutex> seqlock(lock);
	int64_t result;
	if (data.usage_count == 0u) {
		throw SequenceException("currval: sequence is not yet defined in this session");
	}
	result = data.last_value;
	return result;
}